

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O1

void __thiscall Lodtalk::GarbageCollector::abortCompaction(GarbageCollector *this)

{
  ulong *puVar1;
  VMHeap *pVVar2;
  size_t sVar3;
  anon_union_8_4_0eb573b0_for_Oop_0 *paVar4;
  AllocatedObject *liveHeader;
  ulong *puVar5;
  anon_union_8_4_0eb573b0_for_Oop_0 *paVar6;
  long lVar7;
  
  pVVar2 = this->memoryManager->heap;
  puVar5 = (ulong *)pVVar2->addressSpace;
  sVar3 = pVVar2->size;
  puVar1 = (ulong *)((long)puVar5 + sVar3);
  if (0 < (long)sVar3) {
    do {
      lVar7 = puVar5[1] * 8 + 0x18;
      if ((*puVar5 & 1) == 0) {
        lVar7 = (puVar5[1] & 0xff) * 8 + 0x10;
      }
      puVar5[(ulong)((uint)*puVar5 & 1) + 1] =
           puVar5[(ulong)((uint)*puVar5 & 1) + 1] & 0xfffffff8ffffffff;
      puVar5 = (ulong *)((long)puVar5 + lVar7);
    } while (puVar5 < puVar1);
  }
  if (puVar5 == puVar1) {
    paVar4 = &((this->nativeObjects).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>
               ._M_impl.super__Vector_impl_data._M_finish)->field_0;
    for (paVar6 = &((this->nativeObjects).
                    super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>._M_impl.
                    super__Vector_impl_data._M_start)->field_0; paVar6 != paVar4;
        paVar6 = paVar6 + 1) {
      *paVar6->header = (ObjectHeader)(*(ulong *)paVar6->header & 0xfffffff8ffffffff);
    }
    return;
  }
  __assert_fail("live == endAddress",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/MemoryManager.cpp"
                ,0x26b,"void Lodtalk::GarbageCollector::abortCompaction()");
}

Assistant:

void GarbageCollector::abortCompaction()
{
    auto heap = memoryManager->getHeap();
    auto lowestAddress = heap->getAddressSpace();
    auto endAddress = lowestAddress + heap->getSize();

    auto live = lowestAddress;
    while(live < endAddress)
    {
        auto liveHeader = reinterpret_cast<AllocatedObject*> (live);
        auto liveSize = liveHeader->computeSize();

        // Set the color to white.
        liveHeader->header().gcColor = White;

        // Process the next object.
        live += liveSize;
    }
    assert(live == endAddress);

    // Set the white color of the native objects.
    for(auto &nativeObject : nativeObjects)
        nativeObject.header->gcColor = White;
}